

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

void LexHexadecimal(SQChar *s,SQUnsignedInteger *res)

{
  SQUnsignedInteger SVar1;
  int iVar2;
  SQUnsignedInteger *res_local;
  SQChar *s_local;
  
  *res = 0;
  res_local = (SQUnsignedInteger *)s;
  do {
    if ((char)*res_local == '\0') {
      return;
    }
    iVar2 = isdigit((int)(char)*res_local);
    if (iVar2 == 0) {
      iVar2 = isxdigit((int)(char)*res_local);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/deps/squirrel/squirrel/sqlexer.cpp"
                      ,0x1c3,"void LexHexadecimal(const SQChar *, SQUnsignedInteger *)");
      }
      SVar1 = *res;
      iVar2 = toupper((int)(char)*res_local);
      *res = SVar1 * 0x10 + (long)(iVar2 + -0x37);
    }
    else {
      *res = *res * 0x10 + (long)((char)*res_local + -0x30);
    }
    res_local = (SQUnsignedInteger *)((long)res_local + 1);
  } while( true );
}

Assistant:

void LexHexadecimal(const SQChar *s,SQUnsignedInteger *res)
{
    *res = 0;
    while(*s != 0)
    {
        if(scisdigit(*s)) *res = (*res)*16+((*s++)-'0');
        else if(scisxdigit(*s)) *res = (*res)*16+(toupper(*s++)-'A'+10);
        else { assert(0); }
    }
}